

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O3

Option * __thiscall
CLI::App::add_option<int>
          (App *this,string *name,vector<int,_std::allocator<int>_> *variable,string *description)

{
  pointer pcVar1;
  Option *pOVar2;
  _Any_data local_c0;
  code *local_b0;
  code *local_a8;
  _Any_data local_a0;
  code *local_90;
  undefined1 *local_80 [2];
  undefined1 local_70 [16];
  string local_60;
  string local_40;
  
  local_c0._8_8_ = 0;
  local_a8 = std::
             _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:313:31)>
             ::_M_invoke;
  local_b0 = std::
             _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/SX91[P]CLI11/include/CLI/App.hpp:313:31)>
             ::_M_manager;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_c0._M_unused._M_object = variable;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + name->_M_string_length);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_a0,
             (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
              *)&local_c0);
  pcVar1 = (description->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + description->_M_string_length);
  pOVar2 = add_option(this,&local_40,(callback_t *)&local_a0,&local_60,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if (local_90 != (code *)0x0) {
    (*local_90)(&local_a0,&local_a0,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  local_80[0] = local_70;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_80,"INT","");
  ::std::__cxx11::string::_M_assign((string *)&pOVar2->typeval_);
  pOVar2->expected_ = -1;
  pOVar2->changeable_ = true;
  if (local_80[0] != local_70) {
    operator_delete(local_80[0]);
  }
  if (local_b0 != (code *)0x0) {
    (*local_b0)(&local_c0,&local_c0,__destroy_functor);
  }
  return pOVar2;
}

Assistant:

Option *add_option(std::string name,
                       std::vector<T> &variable, ///< The variable vector to set
                       std::string description = "") {

        CLI::callback_t fun = [&variable](CLI::results_t res) {
            bool retval = true;
            variable.clear();
            for(const auto &a : res) {
                variable.emplace_back();
                retval &= detail::lexical_cast(a, variable.back());
            }
            return (!variable.empty()) && retval;
        };

        Option *opt = add_option(name, fun, description, false);
        opt->set_custom_option(detail::type_name<T>(), -1);
        return opt;
    }